

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::funcAllowed
          (SparseTexture2LookupTestCase *this,GLint target,GLint format,FunctionToken *funcToken)

{
  bool bVar1;
  iterator iVar2;
  GLint local_14;
  
  local_14 = target;
  iVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(funcToken->allowedTargets)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(funcToken->allowedTargets)._M_t._M_impl.super__Rb_tree_header) goto LAB_00adec9f;
  if (format == 0x81a5) {
    bVar1 = std::operator==(&funcToken->name,"sparseTextureLodARB");
    if ((bVar1) || (bVar1 = std::operator==(&funcToken->name,"sparseTextureLodOffsetARB"), bVar1)) {
      if (local_14 == 0xde1) goto LAB_00adec36;
    }
    else {
      bVar1 = std::operator==(&funcToken->name,"sparseTextureOffsetARB");
      if ((((bVar1) ||
           (bVar1 = std::operator==(&funcToken->name,"sparseTextureGradOffsetARB"), bVar1)) ||
          (bVar1 = std::operator==(&funcToken->name,"sparseTextureGatherOffsetARB"), bVar1)) ||
         (bVar1 = std::operator==(&funcToken->name,"sparseTextureGatherOffsetsARB"), bVar1)) {
        if (((local_14 == 0xde1) || (local_14 == 0x84f5)) || (local_14 == 0x8c1a))
        goto LAB_00adec36;
      }
      else {
        bVar1 = std::operator==(&funcToken->name,"sparseTexelFetchARB");
        if ((!bVar1) &&
           (bVar1 = std::operator==(&funcToken->name,"sparseTexelFetchOffsetARB"), !bVar1)) {
          bVar1 = std::operator==(&funcToken->name,"sparseTextureGradARB");
          if (bVar1) {
            if (local_14 == 0x9009) goto LAB_00adec9f;
          }
          else {
            bVar1 = std::operator==(&funcToken->name,"sparseImageLoadARB");
            if (bVar1) goto LAB_00adec9f;
          }
          goto LAB_00adec36;
        }
      }
    }
LAB_00adec9f:
    bVar1 = false;
  }
  else {
LAB_00adec36:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SparseTexture2LookupTestCase::funcAllowed(GLint target, GLint format, FunctionToken& funcToken)
{
	if (funcToken.allowedTargets.find(target) == funcToken.allowedTargets.end())
		return false;

	if (format == GL_DEPTH_COMPONENT16)
	{
		if (funcToken.name == "sparseTextureLodARB" || funcToken.name == "sparseTextureLodOffsetARB")
		{
			if (target != GL_TEXTURE_2D)
				return false;
		}
		else if (funcToken.name == "sparseTextureOffsetARB" || funcToken.name == "sparseTextureGradOffsetARB" ||
				 funcToken.name == "sparseTextureGatherOffsetARB" || funcToken.name == "sparseTextureGatherOffsetsARB")
		{
			if (target != GL_TEXTURE_2D && target != GL_TEXTURE_2D_ARRAY && target != GL_TEXTURE_RECTANGLE)
			{
				return false;
			}
		}
		else if (funcToken.name == "sparseTexelFetchARB" || funcToken.name == "sparseTexelFetchOffsetARB")
		{
			return false;
		}
		else if (funcToken.name == "sparseTextureGradARB")
		{
			if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
				return false;
		}
		else if (funcToken.name == "sparseImageLoadARB")
		{
			return false;
		}
	}

	return true;
}